

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *
loadDirectory(vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_> *__return_storage_ptr__,char *path)

{
  pointer *pppSVar1;
  iterator __position;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  ostream *poVar5;
  SVG *pSVar6;
  ulong uVar7;
  SVG *svg;
  string filename;
  string pathname;
  string filesufx;
  SVG *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50 [2];
  long local_40 [2];
  
  __dirp = opendir(path);
  (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (__dirp == (DIR *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Drawer] ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not open directory",0x18);
    if (path == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2309b8);
    }
    else {
      sVar4 = strlen(path);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,path,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    std::ostream::put(-0x48);
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,path,(allocator<char> *)&local_b0);
    if (local_90._M_dataplus._M_p[local_90._M_string_length - 1] != '/') {
      std::__cxx11::string::push_back((char)&local_90);
    }
    uVar7 = 0;
    while( true ) {
      pdVar3 = readdir(__dirp);
      if ((pdVar3 == (dirent *)0x0) || (8 < uVar7)) break;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,pdVar3->d_name,pdVar3->d_name + sVar4);
      std::__cxx11::string::find_last_of((char *)&local_b0,0x1ab422,0xffffffffffffffff);
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b0);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (iVar2 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"[Drawer] Loading ",0x11);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_b0._M_dataplus._M_p,
                            local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"... ",4);
        std::operator+(&local_70,&local_90,&local_b0);
        pSVar6 = loadFile(local_70._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        local_b8 = pSVar6;
        if (pSVar6 == (SVG *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Failed (Invalid SVG file)",0x19);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
          std::ostream::put(-0x48);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Succeeded",9);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
          std::ostream::put(-0x48);
          std::ostream::flush();
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<CGL::SVG*,std::allocator<CGL::SVG*>>::_M_realloc_insert<CGL::SVG*const&>
                      ((vector<CGL::SVG*,std::allocator<CGL::SVG*>> *)__return_storage_ptr__,
                       __position,&local_b8);
          }
          else {
            *__position._M_current = local_b8;
            pppSVar1 = &(__return_storage_ptr__->
                        super__Vector_base<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + 1;
          }
          uVar7 = uVar7 + 1;
        }
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    closedir(__dirp);
    if (uVar7 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Drawer] ",9);
      poVar5 = (ostream *)&std::cerr;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"No valid svg files found in ",0x1c);
      if (path == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x2309b8);
      }
      else {
        sVar4 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,path,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x48);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Drawer] ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Successfully Loaded ",0x14);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," files from ",0xc);
      if (path == (char *)0x0) {
        std::ios::clear((int)poVar5 + (int)*(undefined8 *)(*(long *)poVar5 + -0x18));
      }
      else {
        sVar4 = strlen(path);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,path,sVar4);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    }
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SVG*> loadDirectory( const char* path ) {

  DIR *dir = opendir (path);
  vector<SVG*> svgs;
  if(dir) {
    
    struct dirent *ent; size_t n = 0;
    
    // load files
    string pathname = path; 
    if (pathname[pathname.size()-1] != '/') pathname.push_back('/');
    while (((ent = readdir (dir)) != NULL) && (n < 9)) {

      string filename = ent->d_name;
      string filesufx = filename.substr(filename.find_last_of(".") + 1, 3);
      if (filesufx == "svg" ) {
        cerr << "[Drawer] Loading " << filename << "... "; 
        SVG *svg = loadFile((pathname + filename).c_str());
        if (!svg) {
          cerr << "Failed (Invalid SVG file)" << endl;
        } else {
          cerr << "Succeeded" << endl;
          svgs.push_back(svg);
          n++;
        }
      }
    }

    closedir (dir);

    if (n) {
      msg("Successfully Loaded " << n << " files from " << path);
      return svgs;
    }

    msg("No valid svg files found in " << path);
    return svgs;
  } 

  msg("Could not open directory" << path);
  return svgs;
}